

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O3

void __thiscall
cpsm::
str_cat_impl<char_const*,char_const*,boost::basic_string_ref<char,std::char_traits<char>>,char_const*>
          (cpsm *this,stringstream *ss,char **x,char *args,
          basic_string_ref<char,_std::char_traits<char>_> args_1,char *args_2)

{
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  char *args_1_00;
  char **local_38;
  
  args_1_00 = (char *)args_1.len_;
  poVar1 = (ostream *)(this + 0x10);
  __s = *(char **)ss;
  local_38 = x;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)poVar1 + -0x18) + (int)poVar1);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  str_cat_impl<char_const*,boost::basic_string_ref<char,std::char_traits<char>>,char_const*>
            (this,(stringstream *)&local_38,(char **)args,args_1,args_1_00);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}